

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * format(string *__return_storage_ptr__,string *fmt,string *arg1)

{
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *arg1_local;
  string *fmt_local;
  string *output;
  
  local_21 = 0;
  local_20 = arg1;
  arg1_local = fmt;
  fmt_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"{1}",&local_49);
  replace_positional(__return_storage_ptr__,&local_48,local_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  const std::string& arg1)
{
  std::string output = fmt;
  replace_positional (output, "{1}", arg1);
  return output;
}